

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalException.cpp
# Opt level: O0

void __thiscall
ApprovalTests::ApprovalException::ApprovalException(ApprovalException *this,string *msg)

{
  string *in_RSI;
  exception *in_RDI;
  
  ::std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__ApprovalException_002a5ab0;
  ::std::__cxx11::string::string((string *)(in_RDI + 8),in_RSI);
  return;
}

Assistant:

ApprovalException::ApprovalException(const std::string& msg) : message(msg)
    {
    }